

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall re2::Regexp::ParseState::PushLiteral(ParseState *this,Rune r)

{
  ParseFlags flags;
  bool bVar1;
  Rune RVar2;
  Regexp *this_00;
  CharClassBuilder *this_01;
  
  flags = this->flags_;
  if (((flags & FoldCase) == NoParseFlags) || (RVar2 = CycleFoldRune(r), RVar2 == r)) {
    if (r == 10 && (flags >> 0xb & 1) != 0) {
      this_00 = (Regexp *)operator_new(0x28);
      Regexp(this_00,kRegexpNoMatch,flags);
    }
    else {
      bVar1 = MaybeConcatString(this,r,flags);
      if (bVar1) {
        return true;
      }
      this_00 = (Regexp *)operator_new(0x28);
      Regexp(this_00,kRegexpLiteral,this->flags_);
      (this_00->field_7).rune_ = r;
    }
  }
  else {
    this_00 = (Regexp *)operator_new(0x28);
    Regexp(this_00,kRegexpCharClass,
           flags & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|NonGreedy|
                    Latin1|OneLine|MatchNL|Literal));
    this_01 = (CharClassBuilder *)operator_new(0x40);
    CharClassBuilder::CharClassBuilder(this_01);
    (this_00->field_7).field_3.ccb_ = this_01;
    RVar2 = r;
    do {
      if ((RVar2 != 10) || ((this->flags_ & NeverNL) == NoParseFlags)) {
        CharClassBuilder::AddRange((this_00->field_7).field_3.ccb_,RVar2,RVar2);
      }
      RVar2 = CycleFoldRune(RVar2);
    } while (RVar2 != r);
  }
  PushRegexp(this,this_00);
  return true;
}

Assistant:

bool Regexp::ParseState::PushLiteral(Rune r) {
  // Do case folding if needed.
  if ((flags_ & FoldCase) && CycleFoldRune(r) != r) {
    Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
    re->ccb_ = new CharClassBuilder;
    Rune r1 = r;
    do {
      if (!(flags_ & NeverNL) || r != '\n') {
        re->ccb_->AddRange(r, r);
      }
      r = CycleFoldRune(r);
    } while (r != r1);
    return PushRegexp(re);
  }

  // Exclude newline if applicable.
  if ((flags_ & NeverNL) && r == '\n')
    return PushRegexp(new Regexp(kRegexpNoMatch, flags_));

  // No fancy stuff worked.  Ordinary literal.
  if (MaybeConcatString(r, flags_))
    return true;

  Regexp* re = new Regexp(kRegexpLiteral, flags_);
  re->rune_ = r;
  return PushRegexp(re);
}